

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O3

void __thiscall RangeLock_ErrorWithLockHeld_Test::TestBody(RangeLock_ErrorWithLockHeld_Test *this)

{
  TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *this_00;
  TypedExpectation<void_(unsigned_long,_unsigned_long)> *this_01;
  undefined8 *puVar1;
  range_lock lock;
  mock_file file;
  undefined1 local_4c0 [16];
  Buffer local_4b0;
  testing local_4a0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_498;
  MatcherBase<unsigned_long> local_490;
  MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  local_478;
  MatcherBase<pstore::file::file_base::blocking_mode> local_410;
  MatcherBase<pstore::file::file_base::lock_kind> local_3f8;
  MatcherBase<unsigned_long> local_3e0;
  mock_file local_3c8;
  
  anon_unknown.dwarf_1431b::mock_file::mock_file(&local_3c8);
  local_490.vtable_ =
       (VTable *)
       &testing::internal::MatcherBase<unsigned_long>::
        GetVTable<testing::internal::MatcherBase<unsigned_long>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
        ::kVTable;
  local_490.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001e43c0;
  local_3e0.vtable_ =
       (VTable *)
       &testing::internal::MatcherBase<unsigned_long>::
        GetVTable<testing::internal::MatcherBase<unsigned_long>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
        ::kVTable;
  local_3e0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001e43c0;
  local_3f8.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::file::file_base::lock_kind>::
       GetVTable<testing::internal::MatcherBase<pstore::file::file_base::lock_kind>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_3f8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001e4930;
  local_410.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::file::file_base::blocking_mode>::
       GetVTable<testing::internal::MatcherBase<pstore::file::file_base::blocking_mode>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_410.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001e49d0;
  anon_unknown.dwarf_1431b::mock_file::gmock_lock
            (&local_478,&local_3c8,(Matcher<unsigned_long> *)&local_490,
             (Matcher<unsigned_long> *)&local_3e0,
             (Matcher<pstore::file::file_base::lock_kind> *)&local_3f8,
             (Matcher<pstore::file::file_base::blocking_mode> *)&local_410);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
            ::InternalExpectedAt
                      (&local_478,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                       ,0x13f,"file","lock (_, _, _, _)");
  testing::Return<bool>(local_4a0,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
              *)local_4c0,(ReturnAction *)local_4a0);
  testing::internal::
  TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::WillOnce(this_00,(Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
                      *)local_4c0);
  if ((_Manager_type)local_4b0.ptr != (_Manager_type)0x0) {
    (*(code *)local_4b0)(local_4c0,local_4c0,3);
  }
  if (local_498 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498);
  }
  testing::internal::
  MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::~MockSpec(&local_478);
  testing::internal::MatcherBase<pstore::file::file_base::blocking_mode>::~MatcherBase(&local_410);
  testing::internal::MatcherBase<pstore::file::file_base::lock_kind>::~MatcherBase(&local_3f8);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_3e0);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_490);
  local_4c0._8_8_ =
       &testing::internal::MatcherBase<unsigned_long>::
        GetVTable<testing::internal::MatcherBase<unsigned_long>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
        ::kVTable;
  local_4c0._0_8_ = &PTR__MatcherBase_001e43c0;
  local_490.vtable_ =
       (VTable *)
       &testing::internal::MatcherBase<unsigned_long>::
        GetVTable<testing::internal::MatcherBase<unsigned_long>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
        ::kVTable;
  local_490.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001e43c0;
  anon_unknown.dwarf_1431b::mock_file::gmock_unlock
            ((MockSpec<void_(unsigned_long,_unsigned_long)> *)&local_478,&local_3c8,
             (Matcher<unsigned_long> *)local_4c0,(Matcher<unsigned_long> *)&local_490);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::InternalExpectedAt
                      ((MockSpec<void_(unsigned_long,_unsigned_long)> *)&local_478,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                       ,0x140,"file","unlock (_, _)");
  testing::internal::TypedExpectation<void_(unsigned_long,_unsigned_long)>::Times(this_01,1);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)
             &local_478.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .
              super__Tuple_impl<2UL,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .super__Head_base<2UL,_testing::Matcher<pstore::file::file_base::lock_kind>,_false>);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_478.matchers_);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_490);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)local_4c0);
  pstore::file::range_lock::range_lock
            ((range_lock *)&local_478,&local_3c8.super_file_base,5,7,exclusive_write);
  pstore::file::range_lock::lock((range_lock *)&local_478);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = &PTR__exception_001e3c70;
  __cxa_throw(puVar1,&TestBody()::custom_exception::typeinfo,std::exception::~exception);
}

Assistant:

TEST (RangeLock, ErrorWithLockHeld) {
    mock_file file;

    using ::testing::_;
    EXPECT_CALL (file, lock (_, _, _, _)).WillOnce (::testing::Return (true));
    EXPECT_CALL (file, unlock (_, _)).Times (1);

    class custom_exception : public std::exception {};

    try {
        constexpr auto offset = std::uint64_t{5};
        constexpr auto size = std::size_t{7};
        pstore::file::range_lock lock (&file, offset, size, mock_file::lock_kind::exclusive_write);
        lock.lock ();
        // Throw with the lock held.
        throw custom_exception{};
    } catch (custom_exception const &) {
    } catch (...) {
        GTEST_FAIL () << "An unexpected exception was raised.";
    }
}